

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Graph.cpp
# Opt level: O2

void __thiscall GraphTest::SetUp(GraphTest *this)

{
  Graph<int> *this_00;
  int iVar1;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  this_00 = &this->graph;
  iVar1 = 1;
  local_30 = iVar1;
  graph::Graph<int>::add_edge(this_00,&local_2c,&local_30);
  local_2c = 0;
  local_30 = 2;
  graph::Graph<int>::add_edge(this_00,&local_2c,&local_30);
  local_30 = 3;
  local_2c = iVar1;
  graph::Graph<int>::add_edge(this_00,&local_2c,&local_30);
  local_30 = 4;
  local_2c = iVar1;
  graph::Graph<int>::add_edge(this_00,&local_2c,&local_30);
  local_30 = 5;
  local_2c = 3;
  graph::Graph<int>::add_edge(this_00,&local_2c,&local_30);
  local_30 = 5;
  local_2c = 4;
  graph::Graph<int>::add_edge(this_00,&local_2c,&local_30);
  return;
}

Assistant:

void SetUp() {
        graph.add_edge(0, 1);
        graph.add_edge(0, 2);
        graph.add_edge(1, 3);
        graph.add_edge(1, 4);
        graph.add_edge(3, 5);
        graph.add_edge(4, 5);
    }